

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VarintLen(u64 v)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2 + 1;
    if (v < 0x80) {
      return uVar1;
    }
    v = v >> 7;
    bVar3 = uVar2 < 8;
    uVar2 = uVar1;
  } while (bVar3);
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VarintLen(u64 v){
  int i = 0;
  do{
    i++;
    v >>= 7;
  }while( v!=0 && ALWAYS(i<9) );
  return i;
}